

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O3

void __thiscall ezexample::addns(ezexample *this,char c)

{
  pointer *ppuVar1;
  iterator __position;
  vw *pvVar2;
  bool bVar3;
  size_t sVar4;
  uint64_t uVar5;
  substring sVar6;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  bVar3 = ensure_ns_exists(this,c);
  if (!bVar3) {
    features::clear((this->ec->super_example_predict).feature_space + c);
    __position._M_current =
         (this->past_seeds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->past_seeds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->past_seeds,__position,
                 &this->current_seed);
    }
    else {
      *__position._M_current = this->current_seed;
      ppuVar1 = &(this->past_seeds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    this->current_ns = c;
    this->str[0] = c;
    pvVar2 = this->vw_ref;
    local_50 = local_40;
    sVar4 = strlen(this->str);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,this->str,this->str + sVar4)
    ;
    sVar6.end = local_50 + local_48;
    sVar6.begin = local_50;
    uVar5 = (*pvVar2->p->hasher)(sVar6,(ulong)pvVar2->hash_seed);
    this->current_seed = (fid)uVar5;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return;
}

Assistant:

void addns(char c)
  {
    if (ensure_ns_exists(c))
      return;

    ec->feature_space[(int)c].clear();
    past_seeds.push_back(current_seed);
    current_ns = c;
    str[0] = c;
    current_seed = VW::hash_space(*vw_ref, str);
  }